

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void __thiscall
pugi::impl::anon_unknown_0::xpath_node_set_raw::remove_duplicates
          (xpath_node_set_raw *this,xpath_allocator *alloc)

{
  xml_node_struct *pxVar1;
  bool bVar2;
  xml_attribute_struct *pxVar3;
  xpath_node *it;
  ulong uVar4;
  void *__s;
  xpath_node *pxVar5;
  xpath_node *pxVar6;
  xpath_node *pxVar7;
  xml_node_struct *pxVar8;
  xpath_node *pxVar9;
  uint uVar10;
  long lVar11;
  xpath_node_set_raw *pxVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  xpath_allocator_capture cr;
  xpath_allocator_capture local_40;
  
  if ((this->_type == type_unsorted) &&
     (uVar4 = (long)this->_end - (long)this->_begin, 0x20 < (long)uVar4)) {
    local_40._state._root = alloc->_root;
    local_40._state._root_size = alloc->_root_size;
    local_40._state._error = alloc->_error;
    uVar13 = 1;
    do {
      uVar14 = uVar13;
      uVar13 = uVar14 * 2;
    } while (uVar14 < (uVar4 >> 5) + (uVar4 >> 4));
    local_40._target = alloc;
    __s = xpath_allocator::allocate(alloc,uVar14 * 8);
    if (__s != (void *)0x0) {
      memset(__s,0,uVar14 * 8);
      pxVar5 = this->_begin;
      pxVar6 = pxVar5;
      if (pxVar5 != this->_end) {
        uVar14 = uVar14 - 1;
        do {
          pxVar8 = (xml_node_struct *)(pxVar5->_attribute)._attr;
          if (pxVar8 == (xml_node_struct *)0x0) {
            pxVar8 = (pxVar5->_node)._root;
          }
          if (pxVar8 != (xml_node_struct *)0x0) {
            uVar10 = ((uint)((ulong)pxVar8 >> 0x10) & 0xffff ^ (uint)pxVar8) * -0x7a143595;
            uVar10 = (uVar10 >> 0xd ^ uVar10) * -0x3d4d51cb;
            uVar4 = (ulong)((uVar10 >> 0x10 ^ uVar10) & (uint)uVar14);
            bVar2 = true;
            uVar13 = 0;
            do {
              pxVar1 = *(xml_node_struct **)((long)__s + uVar4 * 8);
              if (pxVar1 == (xml_node_struct *)0x0) {
                *(xml_node_struct **)((long)__s + uVar4 * 8) = pxVar8;
                break;
              }
              if (pxVar1 == pxVar8) break;
              lVar11 = uVar4 + uVar13;
              uVar13 = uVar13 + 1;
              uVar4 = lVar11 + 1U & uVar14;
              bVar2 = uVar13 <= uVar14;
            } while (uVar13 <= uVar14);
            if (!(bool)(~bVar2 & 1U | pxVar1 != (xml_node_struct *)0x0)) {
              pxVar3 = (pxVar5->_attribute)._attr;
              (pxVar6->_node)._root = (pxVar5->_node)._root;
              (pxVar6->_attribute)._attr = pxVar3;
              pxVar6 = pxVar6 + 1;
            }
          }
          pxVar5 = pxVar5 + 1;
        } while (pxVar5 != this->_end);
      }
      this->_end = pxVar6;
    }
    xpath_allocator_capture::~xpath_allocator_capture(&local_40);
  }
  else {
    pxVar6 = this->_end;
    lVar11 = (long)pxVar6 - (long)this->_begin;
    pxVar5 = this->_begin + 1;
    pxVar12 = this;
    do {
      pxVar7 = pxVar5;
      pxVar5 = pxVar7;
      if (lVar11 < 0x11) break;
      auVar17._0_4_ = -(uint)(*(int *)&(pxVar7->_node)._root == *(int *)&pxVar7[-1]._node._root);
      auVar17._4_4_ =
           -(uint)(*(int *)((long)&(pxVar7->_node)._root + 4) ==
                  *(int *)((long)&pxVar7[-1]._node._root + 4));
      auVar17._8_4_ =
           -(uint)(*(int *)&(pxVar7->_attribute)._attr == *(int *)&pxVar7[-1]._attribute._attr);
      auVar17._12_4_ =
           -(uint)(*(int *)((long)&(pxVar7->_attribute)._attr + 4) ==
                  *(int *)((long)&pxVar7[-1]._attribute._attr + 4));
      auVar15._4_4_ = auVar17._0_4_;
      auVar15._0_4_ = auVar17._4_4_;
      auVar15._8_4_ = auVar17._12_4_;
      auVar15._12_4_ = auVar17._8_4_;
      uVar10 = movmskpd((int)pxVar12,auVar15 & auVar17);
      pxVar12 = (xpath_node_set_raw *)(ulong)uVar10;
      pxVar5 = pxVar7 + 1;
      lVar11 = lVar11 + -0x10;
    } while (uVar10 != 3);
    pxVar9 = pxVar7 + -1;
    if (pxVar9 != pxVar6) {
      for (; pxVar7 != pxVar6; pxVar7 = pxVar7 + 1) {
        auVar18._0_4_ = -(uint)(*(int *)&(pxVar9->_node)._root == *(int *)&(pxVar7->_node)._root);
        auVar18._4_4_ =
             -(uint)(*(int *)((long)&(pxVar9->_node)._root + 4) ==
                    *(int *)((long)&(pxVar7->_node)._root + 4));
        auVar18._8_4_ =
             -(uint)(*(int *)&(pxVar9->_attribute)._attr == *(int *)&(pxVar7->_attribute)._attr);
        auVar18._12_4_ =
             -(uint)(*(int *)((long)&(pxVar9->_attribute)._attr + 4) ==
                    *(int *)((long)&(pxVar7->_attribute)._attr + 4));
        auVar16._4_4_ = auVar18._0_4_;
        auVar16._0_4_ = auVar18._4_4_;
        auVar16._8_4_ = auVar18._12_4_;
        auVar16._12_4_ = auVar18._8_4_;
        uVar10 = movmskpd((int)pxVar5,auVar16 & auVar18);
        pxVar5 = (xpath_node *)(ulong)uVar10;
        if (uVar10 != 3) {
          pxVar3 = (pxVar7->_attribute)._attr;
          pxVar9[1]._node._root = (pxVar7->_node)._root;
          pxVar9[1]._attribute._attr = pxVar3;
          pxVar9 = pxVar9 + 1;
        }
      }
      pxVar9 = pxVar9 + 1;
    }
    this->_end = pxVar9;
  }
  return;
}

Assistant:

void remove_duplicates(xpath_allocator* alloc)
		{
			if (_type == xpath_node_set::type_unsorted && _end - _begin > 2)
			{
				xpath_allocator_capture cr(alloc);

				size_t size_ = static_cast<size_t>(_end - _begin);

				size_t hash_size = 1;
				while (hash_size < size_ + size_ / 2) hash_size *= 2;

				const void** hash_data = static_cast<const void**>(alloc->allocate(hash_size * sizeof(void**)));
				if (!hash_data) return;

				memset(hash_data, 0, hash_size * sizeof(const void**));

				xpath_node* write = _begin;

				for (xpath_node* it = _begin; it != _end; ++it)
				{
					const void* attr = it->attribute().internal_object();
					const void* node = it->node().internal_object();
					const void* key = attr ? attr : node;

					if (key && hash_insert(hash_data, hash_size, key))
					{
						*write++ = *it;
					}
				}

				_end = write;
			}
			else
			{
				_end = unique(_begin, _end);
			}
		}